

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O2

void __thiscall ADynamicLight::UnlinkLight(ADynamicLight *this)

{
  TObjPtr<AActor> *obj;
  AActor *pAVar1;
  ADynamicLight *pAVar2;
  FLightNode *pFVar3;
  uint uVar4;
  uint index;
  
  if (this->owned == true) {
    obj = &(this->super_AActor).target;
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar1 != (AActor *)0x0) {
      pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
      index = (pAVar1->dynamiclights).Count;
      uVar4 = index;
      do {
        uVar4 = uVar4 - 1;
        index = index - 1;
        if ((int)index < 0) goto LAB_003909ca;
        pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
        pAVar2 = (ADynamicLight *)
                 GC::ReadBarrier<AActor>
                           ((AActor **)((pAVar1->dynamiclights).Array + (uVar4 & 0x7fffffff)));
      } while (pAVar2 != this);
      pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
      TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Delete(&pAVar1->dynamiclights,index);
    }
  }
LAB_003909ca:
  pFVar3 = this->touching_sides;
  while (pFVar3 != (FLightNode *)0x0) {
    pFVar3 = DeleteLightNode(pFVar3);
    this->touching_sides = pFVar3;
  }
  pFVar3 = this->touching_subsectors;
  while (pFVar3 != (FLightNode *)0x0) {
    pFVar3 = DeleteLightNode(pFVar3);
    this->touching_subsectors = pFVar3;
  }
  pFVar3 = this->touching_sector;
  while (pFVar3 != (FLightNode *)0x0) {
    pFVar3 = DeleteLightNode(pFVar3);
    this->touching_sector = pFVar3;
  }
  return;
}

Assistant:

void ADynamicLight::UnlinkLight ()
{
	if (owned && target != NULL)
	{
		// Delete reference in owning actor
		for(int c=target->dynamiclights.Size()-1; c>=0; c--)
		{
			if (target->dynamiclights[c] == this)
			{
				target->dynamiclights.Delete(c);
				break;
			}
		}
	}
	while (touching_sides) touching_sides = DeleteLightNode(touching_sides);
	while (touching_subsectors) touching_subsectors = DeleteLightNode(touching_subsectors);
	while (touching_sector) touching_sector = DeleteLightNode(touching_sector);
}